

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  Recycler *this_00;
  EntryType *pEVar2;
  code *AllocFunc;
  EntryType *pEVar3;
  ulong uVar4;
  size_t byteSize;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  uVar4 = (ulong)size;
  local_40 = (undefined1  [8])
             &SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_1369e8;
  data.filename._0_4_ = 0x453;
  data.plusSize = uVar4;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar2 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::Recycler::AllocLeafZero;
    }
    else {
      AllocFunc = Memory::Recycler::AllocLeaf;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pEVar2 = (EntryType *)
             new__<Memory::Recycler>(byteSize,this_00,(offset_in_Recycler_to_subr)AllocFunc);
    pEVar3 = pEVar2;
    do {
      (pEVar3->
      super_DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      ).
      super_ImplicitKeyValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
      .
      super_ValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>_>
      .super_ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>.value.string.ptr = (char16_t *)0x0;
      (pEVar3->
      super_DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      ).
      super_ImplicitKeyValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
      .
      super_ValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>_>
      .super_ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>.value.len = 0xffffffff;
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2 + uVar4);
  }
  return pEVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }